

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation-order.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Item *item)

{
  bool bVar1;
  Number *pNVar2;
  Item *item_local;
  ostream *os_local;
  
  bVar1 = std::
          holds_alternative<Grammar::Product,Grammar::Product,Grammar::Sum,Grammar::Number,Grammar::Paren>
                    (item);
  if (bVar1) {
    std::operator<<(os,"*");
  }
  else {
    bVar1 = std::
            holds_alternative<Grammar::Sum,Grammar::Product,Grammar::Sum,Grammar::Number,Grammar::Paren>
                      (item);
    if (bVar1) {
      std::operator<<(os,"+");
    }
    else {
      bVar1 = std::
              holds_alternative<Grammar::Number,Grammar::Product,Grammar::Sum,Grammar::Number,Grammar::Paren>
                        (item);
      if (bVar1) {
        pNVar2 = std::
                 get<Grammar::Number,Grammar::Product,Grammar::Sum,Grammar::Number,Grammar::Paren>
                           (item);
        std::ostream::operator<<(os,pNVar2->value);
      }
      else {
        bVar1 = std::
                holds_alternative<Grammar::Paren,Grammar::Product,Grammar::Sum,Grammar::Number,Grammar::Paren>
                          (item);
        if (bVar1) {
          std::operator<<(os,"(");
        }
      }
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Grammar::Item& item) {
  if (std::holds_alternative<Grammar::Product>(item)) {
    os << "*";
  } else if (std::holds_alternative<Grammar::Sum>(item)) {
    os << "+";
  } else if (std::holds_alternative<Grammar::Number>(item)) {
    os << std::get<Grammar::Number>(item).value;
  } else if (std::holds_alternative<Grammar::Paren>(item)) {
    os << "(";
  }
  return os;
}